

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O3

void regress_poly(reg_object obj,double *x,double *y,double *res,double *varcovar,double alpha)

{
  uint uVar1;
  double *x_00;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  
  uVar3 = obj->p - (uint)(obj->intercept == 1);
  if ((int)uVar3 < 1) {
    printf("The Value of p should be greater than or equal to 2");
    exit(1);
  }
  iVar2 = obj->N;
  lVar5 = (long)iVar2;
  x_00 = (double *)malloc((ulong)uVar3 * lVar5 * 8);
  if (0 < lVar5) {
    memcpy(x_00,x,lVar5 * 8);
  }
  if (uVar3 != 1) {
    uVar1 = 1;
    do {
      uVar1 = uVar1 + 1;
      if (0 < (int)lVar5) {
        lVar4 = 0;
        do {
          dVar6 = pow(x[lVar4],(double)(int)uVar1);
          x_00[iVar2 + lVar4] = (double)(int)dVar6;
          lVar4 = lVar4 + 1;
          lVar5 = (long)obj->N;
        } while (lVar4 < lVar5);
      }
      iVar2 = iVar2 + (int)lVar5;
    } while (uVar1 != uVar3);
  }
  regress(obj,x_00,y,res,varcovar,alpha);
  free(x_00);
  return;
}

Assistant:

void regress_poly(reg_object obj, double *x, double *y, double *res, double *varcovar, double alpha) {
	int polydeg, i, j, sum;
	double *xx;
	/*
	* Performs polynomial regression of the form
	* Y = B0 + B1 * X + B2 * X^2 + ..... + B(p-1) * X ^(p-1)
	*
	* where p is defined as in regular regression
	* p = Number of dependent variables + Independent Variables
	*
	* For p = 3
	* regress_poly calculates coefficients of
	*
	* Y = B0 + B1 * X + B2 * X^2
	*
	*For more information see the functions regress and reg_init
	*/
	if (obj->intercept == 1) {
		polydeg = obj->p - 1;
	}
	else {
		polydeg = obj->p;
	}


	if (polydeg < 1) {
		printf("The Value of p should be greater than or equal to 2");
		exit(1);
	}

	xx = (double*)malloc(sizeof(double) * obj->N * polydeg);
	for (i = 0; i < obj->N; i++)
		xx[i] = x[i];
	sum = obj->N;
	for (i = 1; i < polydeg; ++i) {
		for (j = 0; j < obj->N; ++j) {
			xx[sum + j] = (int)pow((double)x[j], (double)i + 1.);
		}
		sum += obj->N;
	}
	regress(obj, xx, y, res, varcovar, alpha);

	free(xx);
}